

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txvalidation_tests.cpp
# Opt level: O0

CTransactionRef
txvalidation_tests::make_tx(vector<COutPoint,_std::allocator<COutPoint>_> *inputs,int32_t version)

{
  size_type sVar1;
  const_reference __src;
  reference __dest;
  CScript *this;
  reference pvVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  long in_FS_OFFSET;
  CTransactionRef CVar3;
  int i_1;
  size_t i;
  CMutableTransaction mtx;
  CMutableTransaction *in_stack_ffffffffffffff28;
  CMutableTransaction *in_stack_ffffffffffffff30;
  vector<COutPoint,_std::allocator<COutPoint>_> *in_stack_ffffffffffffff38;
  size_type in_stack_ffffffffffffff40;
  vector<CTxIn,_std::allocator<CTxIn>_> *in_stack_ffffffffffffff48;
  ulong uVar4;
  CScript *this_00;
  int local_94;
  ulong local_90;
  CScript local_60;
  pointer local_28;
  pointer pCStack_20;
  pointer local_18;
  pointer pCStack_10;
  pointer local_8;
  
  local_8 = *(pointer *)(in_FS_OFFSET + 0x28);
  this_00 = &local_60;
  CMutableTransaction::CMutableTransaction(in_stack_ffffffffffffff28);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::size
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffff28);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffff48,
             in_stack_ffffffffffffff40);
  local_90 = 0;
  while( true ) {
    uVar4 = local_90;
    sVar1 = std::vector<COutPoint,_std::allocator<COutPoint>_>::size
                      ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffff28);
    if (sVar1 <= uVar4) break;
    __src = std::vector<COutPoint,_std::allocator<COutPoint>_>::operator[]
                      (in_stack_ffffffffffffff38,(size_type)in_stack_ffffffffffffff30);
    __dest = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                       ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffff38,
                        (size_type)in_stack_ffffffffffffff30);
    memcpy(__dest,__src,0x24);
    local_90 = local_90 + 1;
  }
  for (local_94 = 0; local_94 < 0x19; local_94 = local_94 + 1) {
    local_18 = (pointer)0x0;
    pCStack_10 = (pointer)0x0;
    local_28 = (pointer)0x0;
    pCStack_20 = (pointer)0x0;
    in_stack_ffffffffffffff30 = (CMutableTransaction *)&stack0xffffffffffffffd8;
    CScript::CScript((CScript *)in_stack_ffffffffffffff28);
    this = CScript::operator<<(this_00,(opcodetype)((ulong)in_RDI >> 0x20));
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)this,(size_type)in_stack_ffffffffffffff30)
    ;
    CScript::operator=(this,(CScript *)in_stack_ffffffffffffff30);
    CScript::~CScript((CScript *)in_stack_ffffffffffffff28);
    pvVar2 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                       ((vector<CTxOut,_std::allocator<CTxOut>_> *)this,
                        (size_type)in_stack_ffffffffffffff30);
    pvVar2->nValue = 10000;
  }
  MakeTransactionRef<CMutableTransaction&>(in_stack_ffffffffffffff30);
  CMutableTransaction::~CMutableTransaction(in_stack_ffffffffffffff28);
  if (*(pointer *)(in_FS_OFFSET + 0x28) == local_8) {
    CVar3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    CVar3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
    return (CTransactionRef)CVar3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  __stack_chk_fail();
}

Assistant:

static inline CTransactionRef make_tx(const std::vector<COutPoint>& inputs, int32_t version)
{
    CMutableTransaction mtx = CMutableTransaction{};
    mtx.version = version;
    mtx.vin.resize(inputs.size());
    mtx.vout.resize(25);
    for (size_t i{0}; i < inputs.size(); ++i) {
        mtx.vin[i].prevout = inputs[i];
    }
    for (auto i{0}; i < 25; ++i) {
        mtx.vout[i].scriptPubKey = CScript() << OP_TRUE;
        mtx.vout[i].nValue = 10000;
    }
    return MakeTransactionRef(mtx);
}